

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QSize __thiscall QMdiArea::sizeHint(QMdiArea *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  QMdiArea *pQVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  QObject *pQVar9;
  ulong uVar10;
  QMdiSubWindow *child;
  int iVar11;
  undefined1 *puVar12;
  long lVar13;
  
  iVar11 = 0;
  puVar12 = &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  for (pQVar9 = (QObject *)puVar12; pQVar9 = *(QObject **)(*(long *)pQVar9 + 0x10),
      pQVar9 != (QObject *)0x0; pQVar9 = pQVar9 + 8) {
    pQVar5 = QtPrivate::qobject_cast_helper<QMdiArea*,QObject>(pQVar9);
    iVar11 = (iVar11 + 1) - (uint)(pQVar5 == (QMdiArea *)0x0);
  }
  iVar11 = iVar11 * 3 + 3;
  QGuiApplication::primaryScreen();
  uVar6 = QScreen::virtualSize();
  uVar10 = (long)((int)uVar6 * 2) / (long)iVar11 & 0xffffffff;
  uVar6 = (long)((long)(int)(uVar6 >> 0x1f) & 0xfffffffffffffffeU) / (long)iVar11 & 0xffffffff;
  lVar1 = *(long *)puVar12;
  lVar2 = *(long *)(lVar1 + 0x360);
  lVar1 = *(long *)(lVar1 + 0x368);
  for (lVar13 = 0; lVar1 << 4 != lVar13; lVar13 = lVar13 + 0x10) {
    lVar3 = *(long *)(lVar2 + lVar13);
    if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
      child = (QMdiSubWindow *)0x0;
    }
    else {
      child = *(QMdiSubWindow **)(lVar2 + 8 + lVar13);
    }
    bVar4 = sanityCheck(child,"QMdiArea::sizeHint");
    if (bVar4) {
      uVar7 = (**(code **)(*(long *)&child->super_QWidget + 0x70))(child);
      if ((int)uVar10 <= (int)uVar7) {
        uVar10 = uVar7 & 0xffffffff;
      }
      uVar8 = (uint)(uVar7 >> 0x20);
      if ((int)uVar8 < (int)(uint)uVar6) {
        uVar8 = (uint)uVar6;
      }
      uVar6 = (ulong)uVar8;
    }
  }
  return (QSize)(uVar10 | uVar6 << 0x20);
}

Assistant:

QSize QMdiArea::sizeHint() const
{
    // Calculate a proper scale factor for the desktop's size.
    // This also takes into account that we can have nested workspaces.
    int nestedCount = 0;
    QWidget *widget = this->parentWidget();
    while (widget) {
        if (qobject_cast<QMdiArea *>(widget))
            ++nestedCount;
        widget = widget->parentWidget();
    }
    const int scaleFactor = 3 * (nestedCount + 1);

    QSize desktopSize = QGuiApplication::primaryScreen()->virtualSize();
    QSize size(desktopSize.width() * 2 / scaleFactor, desktopSize.height() * 2 / scaleFactor);
    for (QMdiSubWindow *child : d_func()->childWindows) {
        if (!sanityCheck(child, "QMdiArea::sizeHint"))
            continue;
        size = size.expandedTo(child->sizeHint());
    }
    return size;
}